

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-test.c++
# Opt level: O2

void __thiscall
capnp::_::anon_unknown_0::TestDynamicStructHandler::decode
          (TestDynamicStructHandler *this,JsonCodec *codec,Reader input,Builder output)

{
  Reader input_00;
  Field field;
  BuilderArena *pBVar1;
  CapTableBuilder *pCVar2;
  Type type;
  Orphanage orphanage;
  Reader item;
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition;
  StructBuilder inner;
  Reader items;
  FieldList fields;
  IndexingIterator<const_capnp::StructSchema::FieldList,_capnp::StructSchema::Field> local_1c0;
  StructReader local_1b0;
  undefined1 local_180 [24];
  bool local_168 [32];
  SegmentReader *local_148;
  CapTableReader *pCStack_140;
  short *local_138;
  WirePointer *pWStack_130;
  undefined8 local_128;
  int iStack_120;
  undefined4 uStack_11c;
  Schema local_118;
  CapTableBuilder *pCStack_110;
  SegmentReader *local_108;
  WirePointer *pWStack_100;
  void *local_f8;
  WirePointer *pWStack_f0;
  StructDataBitCount local_e8;
  StructPointerCount SStack_e4;
  undefined2 uStack_e2;
  int iStack_e0;
  undefined4 uStack_dc;
  undefined1 local_d8 [16];
  SegmentReader *local_c8;
  WirePointer *pWStack_c0;
  void *local_b8;
  WirePointer *pWStack_b0;
  StructDataBitCount local_a8;
  StructPointerCount SStack_a4;
  undefined2 uStack_a2;
  int iStack_a0;
  undefined4 uStack_9c;
  ListReader local_98;
  FieldList local_68;
  
  local_b8 = (void *)output.builder._32_8_;
  local_c8 = (SegmentReader *)output.builder.data;
  pWStack_c0 = output.builder.pointers;
  local_d8._0_8_ = output.builder.segment;
  local_d8._8_8_ = output.builder.capTable;
  pBVar1 = StructBuilder::getArena((StructBuilder *)local_d8);
  pCVar2 = StructBuilder::getCapTable((StructBuilder *)local_d8);
  local_d8._0_8_ = output.schema.super_Schema.raw;
  StructSchema::getFields(&local_68,(StructSchema *)local_d8);
  capnp::json::Value::Reader::getArray((Reader *)&local_98,&input);
  local_1c0.index = 0;
  local_1c0.container = &local_68;
  while( true ) {
    if (local_1c0.index == local_68.list.reader.elementCount) {
      return;
    }
    IndexingIterator<const_capnp::StructSchema::FieldList,_capnp::StructSchema::Field>::operator*
              ((Field *)local_d8,&local_1c0);
    local_180._0_4_ = local_d8._8_4_;
    local_180._4_4_ = local_98.elementCount;
    local_180._8_8_ = " < ";
    local_180._16_8_ = (anon_union_8_2_eba6ea51_for_Type_5)0x4;
    local_168[0] = (uint)local_d8._8_4_ < local_98.elementCount;
    if (!local_168[0]) break;
    ListReader::getStructElement(&local_1b0,&local_98,local_d8._8_4_);
    if ((0xf < local_1b0.dataSize) && (*local_1b0.data != 0)) {
      local_e8 = local_a8;
      SStack_e4 = SStack_a4;
      uStack_e2 = uStack_a2;
      iStack_e0 = iStack_a0;
      uStack_dc = uStack_9c;
      local_f8 = local_b8;
      pWStack_f0 = pWStack_b0;
      local_108 = local_c8;
      pWStack_100 = pWStack_c0;
      local_118.raw = (RawBrandedSchema *)local_d8._0_8_;
      pCStack_110 = (CapTableBuilder *)local_d8._8_8_;
      local_128 = CONCAT44(local_1b0._36_4_,local_1b0.dataSize);
      local_148 = local_1b0.segment;
      pCStack_140 = local_1b0.capTable;
      local_138 = (short *)local_1b0.data;
      pWStack_130 = local_1b0.pointers;
      iStack_120 = local_1b0.nestingLimit;
      uStack_11c = local_1b0._44_4_;
      type = StructSchema::Field::getType((Field *)local_d8);
      input_00._reader.capTable = pCStack_140;
      input_00._reader.segment = local_148;
      input_00._reader.data = local_138;
      input_00._reader.pointers = pWStack_130;
      input_00._reader.dataSize = (undefined4)local_128;
      input_00._reader.pointerCount = local_128._4_2_;
      input_00._reader._38_2_ = local_128._6_2_;
      input_00._reader.nestingLimit = iStack_120;
      input_00._reader._44_4_ = uStack_11c;
      orphanage.capTable = pCVar2;
      orphanage.arena = pBVar1;
      JsonCodec::decode((Orphan<capnp::DynamicValue> *)local_180,codec,input_00,type,orphanage);
      field._8_8_ = pCStack_110;
      field.parent.super_Schema.raw = (Schema)(Schema)local_118.raw;
      field.proto._reader.segment = local_108;
      field.proto._reader.capTable = (CapTableReader *)pWStack_100;
      field.proto._reader.data = local_f8;
      field.proto._reader.pointers = pWStack_f0;
      field.proto._reader.dataSize = local_e8;
      field.proto._reader.pointerCount = SStack_e4;
      field.proto._reader._38_2_ = uStack_e2;
      field.proto._reader.nestingLimit = iStack_e0;
      field.proto._reader._44_4_ = uStack_dc;
      DynamicStruct::Builder::adopt(&output,field,(Orphan<capnp::DynamicValue> *)local_180);
      OrphanBuilder::~OrphanBuilder((OrphanBuilder *)local_168);
    }
    local_1c0.index = local_1c0.index + 1;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_int>&>
            ((Fault *)&local_1b0,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/json-test.c++"
             ,0x2ea,FAILED,"field.getIndex() < items.size()","_kjCondition,",
             (DebugComparison<unsigned_int,_unsigned_int> *)local_180);
  kj::_::Debug::Fault::fatal((Fault *)&local_1b0);
}

Assistant:

void decode(const JsonCodec& codec, JsonValue::Reader input,
              DynamicStruct::Builder output) const override {
    auto orphanage = Orphanage::getForMessageContaining(output);
    auto fields = output.getSchema().getFields();
    auto items = input.getArray();
    for (auto field: fields) {
      KJ_REQUIRE(field.getIndex() < items.size());
      auto item = items[field.getIndex()];
      if (!item.isNull()) {
        output.adopt(field, codec.decode(item, field.getType(), orphanage));
      }
    }
  }